

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::Read(ON_Mesh *this,ON_BinaryArchive *file)

{
  int iVar1;
  ON_3dPointArray *dV;
  ON_2fPoint OVar2;
  ON_2dPoint *src;
  double dVar3;
  double tex_y;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  endian eVar8;
  uint uVar9;
  uint uVar10;
  ON_MeshParameters *this_00;
  ON_MeshCurvatureStats *this_01;
  int iVar11;
  uint *puVar13;
  ON_BinaryArchive *pOVar14;
  ulong uVar15;
  uint extraout_XMM0_Dd;
  ON_3fVector OVar16;
  uchar b;
  int minor_version;
  int vcount;
  bool bHasNgons;
  ON__UINT32 tcode;
  int major_version;
  bool bHasDoublePrecisionVertices;
  int b_packed_tex_rotate;
  int fcount;
  ON__INT64 big_value;
  float fbbox [2] [3];
  bool bFailedCRC;
  ON__UINT8 local_b5;
  ON__INT32 local_b4;
  int local_b0;
  ON__INT32 local_ac;
  bool local_a5;
  uint local_a4;
  uint local_a0;
  bool local_99;
  ON_2dPoint local_98;
  ON__INT32 local_84;
  ON__INT64 local_80;
  float local_78 [6];
  ON_3fVector local_60;
  ON_SimpleArray<ON_3dPoint> *local_50;
  undefined4 local_48;
  uint uStack_44;
  uint uStack_3c;
  ON__UINT8 *pOVar12;
  
  Destroy(this);
  local_a0 = 0;
  local_b0 = 0;
  bVar5 = ON_BinaryArchive::Read3dmChunkVersion(file,(int *)&local_a0,&local_b0);
  if (!bVar5) {
    return false;
  }
  if ((local_a0 & 0xfffffffd) != 1) {
    return true;
  }
  local_ac = 0;
  local_84 = 0;
  bVar5 = ON_BinaryArchive::ReadInt(file,&local_ac);
  if (((((bVar5) && (bVar5 = ON_BinaryArchive::ReadInt(file,&local_84), bVar5)) &&
       (bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)&this->field_0x270), bVar5)) &&
      ((bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)&this->field_0x280), bVar5 &&
       (bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)&this->field_0x240), bVar5)))) &&
     (bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)&this->field_0x250), bVar5)) {
    bVar5 = ON_BinaryArchive::ReadDouble(file,2,this->m_srf_scale);
    local_78[0] = 1.0;
    local_78[1] = 1.0;
    local_78[2] = 1.0;
    local_78[3] = -1.0;
    local_78[4] = -1.0;
    local_78[5] = -1.0;
    if ((!bVar5) || (bVar5 = ON_BinaryArchive::ReadFloat(file,6,local_78), !bVar5))
    goto LAB_004fc60a;
    if (local_78[0] <= local_78[3]) {
      if (local_78[1] <= local_78[4]) {
        if (local_78[2] <= local_78[5]) {
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)&local_98,local_78);
          ON_3dPoint::operator=(&(this->m_vertex_bbox).m_min,(ON_3fPoint *)&local_98);
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)&local_98,local_78 + 3);
          ON_3dPoint::operator=(&(this->m_vertex_bbox).m_max,(ON_3fPoint *)&local_98);
        }
      }
    }
    bVar5 = ON_BinaryArchive::ReadFloat(file,6,this->m_nbox[0]);
    if (!bVar5) goto LAB_004fc60a;
    bVar5 = ON_BinaryArchive::ReadFloat(file,4,this->m_tbox[0]);
    local_b4 = -1;
    if ((!bVar5) || (bVar5 = ON_BinaryArchive::ReadInt(file,&local_b4), !bVar5)) goto LAB_004fc60a;
    if ((local_b4 == 2) || (local_b4 == 1)) {
      if (this->m_mesh_is_closed != '\x01') {
        this->m_mesh_is_closed = '\x01';
        goto LAB_004fcb58;
      }
    }
    else if ((local_b4 == 0) && (this->m_mesh_is_solid = '\x03', this->m_mesh_is_closed != '\x02'))
    {
      this->m_mesh_is_closed = '\x02';
LAB_004fcb58:
      this->m_mesh_is_manifold = '\0';
      this->m_mesh_is_oriented = '\0';
    }
    local_b5 = '\0';
    local_a4 = 0;
    local_80 = 0;
    bVar5 = ON_BinaryArchive::ReadChar(file,&local_b5);
    if ((bVar5) && (local_b5 != '\0')) {
      bVar5 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_a4,&local_80);
      if (bVar5) {
        bVar6 = false;
        if (local_a4 == 0x40008000) {
          this_00 = (ON_MeshParameters *)operator_new(0xe0);
          memset(this_00,0,0xe0);
          ON_MeshParameters::ON_MeshParameters(this_00);
          this->m_mesh_parameters = this_00;
          bVar6 = ON_MeshParameters::Read(this_00,file);
        }
        bVar7 = ON_BinaryArchive::EndRead3dmChunk(file);
        bVar5 = false;
        if (bVar7) {
          bVar5 = bVar6;
        }
        goto LAB_004fcc05;
      }
      goto LAB_004fc620;
    }
LAB_004fcc05:
    local_b4 = 0;
    if (bVar5 != false) {
      do {
        pOVar12 = &local_b5;
        bVar5 = ON_BinaryArchive::ReadChar(file,&local_b5);
        iVar11 = (int)pOVar12;
        if ((bVar5) && (local_b5 != '\0')) {
          local_a4 = 0;
          local_80 = 0;
          puVar13 = &local_a4;
          bVar5 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_a4,&local_80);
          iVar11 = (int)puVar13;
          if (!bVar5) {
            local_b4 = local_b4 + 1;
            goto LAB_004fc628;
          }
          if (local_a4 == 0x40008000) {
            this_01 = (ON_MeshCurvatureStats *)operator_new(0x40);
            ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_01);
            this->m_kstat[local_b4] = this_01;
            pOVar14 = file;
            bVar5 = ON_MeshCurvatureStats::Read(this_01,file);
            iVar11 = (int)pOVar14;
          }
          else {
            bVar5 = false;
          }
          bVar6 = ON_BinaryArchive::EndRead3dmChunk(file);
          if (!bVar6) {
            bVar5 = false;
          }
        }
        iVar1 = local_b4 + 1;
      } while ((bVar5 != false) && (bVar6 = local_b4 < 3, local_b4 = iVar1, bVar6));
      local_b4 = iVar1;
      if (bVar5 != false) {
        bVar5 = ReadFaceArray(this,iVar11,local_84,file);
      }
    }
    if (bVar5 != false) {
      if (local_a0 == 3) {
        bVar5 = Read_2(this,local_ac,file);
        goto LAB_004fc62a;
      }
      if (local_a0 == 1) {
        bVar5 = Read_1(this,file);
        goto LAB_004fc62a;
      }
      goto LAB_004fc628;
    }
  }
  else {
    local_78[0] = 1.0;
    local_78[1] = 1.0;
    local_78[2] = 1.0;
    local_78[3] = -1.0;
    local_78[4] = -1.0;
    local_78[5] = -1.0;
LAB_004fc60a:
    local_b5 = '\0';
    local_a4 = 0;
    local_80 = 0;
LAB_004fc620:
    local_b4 = 0;
LAB_004fc628:
    bVar5 = false;
  }
LAB_004fc62a:
  if (local_b0 < 2) goto LAB_004fc9bf;
  local_98.x._0_4_ = (uint)this->m_packed_tex_rotate;
  uVar9 = (uint)this->m_packed_tex_rotate;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_98);
    uVar9 = local_98.x._0_4_;
  }
  this->m_packed_tex_rotate = uVar9 != 0;
  if ((local_a0 != 3) || (local_b0 < 3)) goto LAB_004fc9bf;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadUuid(file,&(this->m_Ttag).m_mapping_id);
  }
  if ((bVar5 != false) && (0 < local_ac)) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_98.y;
    local_98 = (ON_2dPoint)(auVar4 << 0x40);
    local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
    bVar5 = ON_BinaryArchive::ReadCompressedBufferSize(file,(size_t *)&local_98);
    if (local_98.x != 0.0 && bVar5) {
      if (local_98.x == (double)((long)local_ac << 4)) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)local_ac);
        bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,(size_t)local_98.x,(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,
                           (bool *)&local_60);
        if (((bVar5) && (-1 < local_ac)) &&
           (local_ac <= (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity)) {
          (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = local_ac;
        }
        eVar8 = ON_BinaryArchive::Endian(file);
        if (eVar8 == big_endian) {
          src = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
          ON_BinaryArchive::ToggleByteOrder
                    ((long)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count * 2,8,src,src);
        }
      }
      else {
        bVar5 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xa6a,"","ON_Mesh::Read - surface parameter buffer size is wrong.");
        uVar9 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
        if (uVar9 < 0xbfb2f6a) {
          if ((ulong)local_98.x < 0x10 ||
              ((undefined1  [16])local_98 & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
            bVar5 = false;
          }
          else {
            ON_SimpleArray<ON_2dPoint>::SetCapacity
                      (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,
                       (long)(int)((ulong)local_98.x >> 4));
            bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                              (file,(size_t)local_98.x,
                               (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,(bool *)&local_60);
            ON_SimpleArray<ON_2dPoint>::SetCapacity(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,0)
            ;
          }
        }
      }
    }
  }
  if ((local_b0 < 4) || (uVar9 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar9 < 0xbf5013a)
     ) goto LAB_004fc9bf;
  if (bVar5 != false) {
    bVar5 = ON_MappingTag::Read(&this->m_Ttag,file);
  }
  if (local_b0 < 5) goto LAB_004fc9bf;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_mesh_is_manifold);
  }
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_mesh_is_oriented);
  }
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_mesh_is_solid);
  }
  if ((bVar5 == false) || (local_b0 < 6)) goto LAB_004fc9bf;
  local_a5 = false;
  bVar5 = ON_BinaryArchive::ReadBool(file,&local_a5);
  if (bVar5) {
    bVar5 = true;
    if (local_a5 == true) {
      bVar5 = ReadMeshNgons(file,&this->m_NgonAllocator,&this->m_Ngon);
    }
    if ((bVar5 == false) || (local_b0 < 7)) goto LAB_004fc9bf;
    local_99 = false;
    bVar5 = ON_BinaryArchive::ReadBool(file,&local_99);
    if (local_99 == true) {
      dV = &this->m_dV;
      bVar5 = ReadMeshDoublePrecisionVertices(file,&dV->super_ON_SimpleArray<ON_3dPoint>);
      if (!bVar5) goto LAB_004fc9bd;
      uVar9 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
      uVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      local_50 = &dV->super_ON_SimpleArray<ON_3dPoint>;
      if (uVar9 == uVar10) {
        if (uVar9 != 0) {
          uVar15 = 0;
          do {
            ON_3fPoint::ON_3fPoint
                      ((ON_3fPoint *)&local_98,
                       (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a + uVar15);
            dVar3 = ON_3fPoint::MaximumCoordinate
                              ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar15);
            local_48 = SUB84(dVar3,0);
            uStack_44 = (uint)((ulong)dVar3 >> 0x20) & 0x7fffffff;
            uStack_3c = extraout_XMM0_Dd & 0x7fffffff;
            OVar16 = ON_3fPoint::operator-
                               ((ON_3fPoint *)&local_98,
                                (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar15);
            local_60.z = OVar16.z;
            local_60._0_8_ = OVar16._0_8_;
            dVar3 = ON_3fVector::MaximumCoordinate(&local_60);
            if ((double)CONCAT44(uStack_44,local_48) * 1e-06 < ABS(dVar3)) {
              ON_SimpleArray<ON_3dPoint>::SetCapacity(local_50,0);
              bVar6 = true;
              goto LAB_004fcd21;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar9);
        }
        bVar6 = false;
LAB_004fcd21:
        uVar9 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
        uVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      }
      else {
        bVar6 = false;
      }
      bVar5 = true;
      if ((uVar9 == uVar10) && (local_b0 < 8)) {
        ON_BoundingBox::Set(&this->m_vertex_bbox,local_50,0);
      }
    }
    else {
      bVar6 = false;
    }
    if ((bVar5 != false) && (7 < local_b0)) {
      bVar5 = ON_BinaryArchive::ReadBoundingBox(file,&this->m_vertex_bbox);
    }
    if (bVar6) {
      ON_BoundingBox::Set(&this->m_vertex_bbox,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,0);
    }
  }
  else {
LAB_004fc9bd:
    bVar5 = false;
  }
LAB_004fc9bf:
  if (((((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == 0) &&
       (iVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar11)) &&
      ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar11)) &&
     (((bVar6 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240), bVar6 &&
       (bVar6 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250), bVar6)) &&
      ((bVar6 = ON_Interval::IsInterval((ON_Interval *)&this->field_0x270), bVar6 &&
       ((bVar6 = ON_Interval::IsInterval((ON_Interval *)&this->field_0x280), bVar6 &&
        ((this->m_Ttag).m_mapping_crc == 0)))))))) {
    bVar6 = ON_UuidIsNil(&(this->m_Ttag).m_mapping_id);
    if (bVar6) {
      ON_SimpleArray<ON_2dPoint>::SetCapacity
                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)local_ac);
      if (-1 < (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
        (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
      }
      local_b4 = 0;
      if (0 < local_ac) {
        do {
          OVar2 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a[local_b4];
          dVar3 = (double)OVar2.x;
          tex_y = (double)OVar2.y;
          local_98.y._0_4_ = SUB84(tex_y,0);
          local_98.x = dVar3;
          local_98.y._4_4_ = (int)((ulong)tex_y >> 0x20);
          GetSurfaceParametersHelper(this,dVar3,tex_y,&local_98.x,&local_98.y);
          ON_SimpleArray<ON_2dPoint>::Append
                    (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,&local_98);
          local_b4 = local_b4 + 1;
        } while (local_b4 < local_ac);
      }
      ON_MappingTag::Set(&this->m_Ttag,&ON_TextureMapping::SurfaceParameterTextureMapping);
    }
  }
  return bVar5;
}

Assistant:

bool ON_Mesh::Read( ON_BinaryArchive& file )
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  int i;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc && (1 == major_version || 3 == major_version) ) 
  {
    int vcount = 0;
    int fcount = 0;

    if (rc) rc = file.ReadInt( &vcount );
    if (rc) rc = file.ReadInt( &fcount );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[0] );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[1] );
    if (rc) rc = file.ReadInterval( m_srf_domain[0] );
    if (rc) rc = file.ReadInterval( m_srf_domain[1] );
    if (rc) rc = file.ReadDouble( 2, m_srf_scale );

    float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
    if (rc) rc = file.ReadFloat( 6, &fbbox[0][0] );
    if (rc && fbbox[0][0] <= fbbox[1][0] && fbbox[0][1] <= fbbox[1][1] && fbbox[0][2] <= fbbox[1][2] )
    {
      // When minor_version >= 8, m_vertex_bbox will be read from the archive later.
      m_vertex_bbox.m_min = ON_3fPoint(fbbox[0]);
      m_vertex_bbox.m_max = ON_3fPoint(fbbox[1]);
    }

    if (rc) rc = file.ReadFloat( 6, &m_nbox[0][0] );
    if (rc) rc = file.ReadFloat( 4, &m_tbox[0][0] );

    // int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
    i = -1;
    if (rc) rc = file.ReadInt( &i );
    if (rc)
    {
      switch(i)
      {
      case 0: // not closed;
        SetClosed(0);
        break;
      case 1: // closed;
        SetClosed(1);
        break;
      case 2: // 13 April 2010 Dale Lear - "2" value is obsolete but appears in old files
        SetClosed(1);
        break;
      }
    }

    unsigned char b = 0;
    ON__UINT32 tcode=0;
    ON__INT64 big_value=0;
    if (rc) rc = file.ReadChar(&b);
    if (rc && b) 
    {
      // mesh parameters are in an anonymous chunk
      rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
      if (rc) 
      {
        if ( TCODE_ANONYMOUS_CHUNK == tcode )
        {
          m_mesh_parameters = new ON_MeshParameters();
          rc = m_mesh_parameters->Read( file );
        }
        else
          rc = false;
        if (!file.EndRead3dmChunk())
          rc = false;
      }
    }

    for ( i = 0; rc && i < 4; i++ ) 
    {
      rc = file.ReadChar(&b);
      if (rc && b) 
      {
        // m_kstat[i] curvature stats are in an anonymous chunk
        tcode = 0;
        big_value = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
        if (rc) 
        {
          if ( TCODE_ANONYMOUS_CHUNK == tcode )
          {
            m_kstat[i] = new ON_MeshCurvatureStats();
            rc = m_kstat[i]->Read(file);
          }
          else
            rc = false;
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if (rc) rc = ReadFaceArray( vcount, fcount, file );

    if (rc) {
      if ( major_version==1) {
        rc = Read_1(file);
      }
      else if ( major_version == 3 ) {
        rc = Read_2(vcount,file);
      }
      else
        rc = false;
    }

    if ( minor_version >= 2 ) 
    {
      int b_packed_tex_rotate = m_packed_tex_rotate;
      if (rc) rc = file.ReadInt( &b_packed_tex_rotate );
      m_packed_tex_rotate = b_packed_tex_rotate?true:false;
    }

    if ( 3 == major_version )
    {
      if ( minor_version >= 3 )
      {
        // added for minor version 3.3
        if (rc) rc = file.ReadUuid( m_Ttag.m_mapping_id );

        // compressed m_S[]
        if ( rc && vcount > 0 ) 
        {
          size_t sz = 0;
          bool bFailedCRC=false;
          if (rc) rc = file.ReadCompressedBufferSize( &sz );
          if (rc && sz) 
          {
            if ( sz == vcount*sizeof(ON_2dPoint) )
            {
              m_S.SetCapacity(vcount);
              if (rc) rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
              if (rc) m_S.SetCount(vcount);
              if (ON::endian::big_endian == file.Endian())
              {
                file.ToggleByteOrder( m_S.Count()*2, 8, m_S.Array(), (void*)m_S.Array() );
              }
            }
            else
            {
              ON_ERROR("ON_Mesh::Read - surface parameter buffer size is wrong.");
              if (    rc
                   && file.ArchiveOpenNURBSVersion() <= 201011049 
                   && 0 == (sz % sizeof(ON_2dPoint))
                   && sz >= sizeof(ON_2dPoint)
                 )
              {
                // Before 201011049 there was a bug that let m_S[] arrays with
                // the wrong size get saved in files. There was also a bug in 
                // the Rhino .OBJ file reader that created meshes with m_S[] 
                // arrays that had the wrong size.  The next 4 lines of code
                // let us read the junk, discard it and then successfully read
                // the rest of the file.
                int Scount = (int)(sz / sizeof(ON_2dPoint));
                m_S.SetCapacity(Scount);
                rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
                m_S.Destroy();
              }
              else
              {
                rc = false; // buffer is wrong size
              }
            }
          }
        }
        if ( minor_version >= 4 && file.ArchiveOpenNURBSVersion() >= 200606010 )
        {
          if (rc) rc = m_Ttag.Read(file);
          if ( minor_version >= 5 )
          {
            if (rc) rc = file.ReadChar( &m_mesh_is_manifold );
            if (rc) rc = file.ReadChar( &m_mesh_is_oriented );
            if (rc) rc = file.ReadChar( &m_mesh_is_solid );

            if ( rc && minor_version >= 6 )
            {
              // added n-gons version 3.6
              bool bHasNgons = false;    
              rc =  file.ReadBool(&bHasNgons);
              if (rc && bHasNgons)
                rc = ReadMeshNgons(file, m_NgonAllocator, m_Ngon);
              if (rc && minor_version >= 7)
              {
                bool bHasDoublePrecisionVertices = false;
                rc = file.ReadBool(&bHasDoublePrecisionVertices);
                bool bHasInvalidDoublePrecisionVertices = false;
                if (bHasDoublePrecisionVertices)
                {
                  // Added explicit double precision vertices chunk version 3.7
                  // (used to be on user data)
                  rc = ReadMeshDoublePrecisionVertices(file, m_dV);
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount())
                  {
                    // Validate m_dV[] - some files contain different values for m_V[] and m_dV[].
                    // When this happens, delete m_dV[].
                    const unsigned int dvcount = m_dV.UnsignedCount();
                    for (unsigned int vdex = 0; vdex < dvcount; vdex++)
                    {
                      const ON_3fPoint P(m_dV[vdex]);
                      const double m = fabs(m_V[vdex].MaximumCoordinate());
                      const double d = fabs((P - m_V[vdex]).MaximumCoordinate());
                      if (d <= m*1.0e-6)
                        continue;
                      bHasInvalidDoublePrecisionVertices = true;
                      m_dV.Destroy();
                      break;
                    }
                  }
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount() && minor_version <= 7)
                  {
                    m_vertex_bbox.Set(m_dV, false);
                  }
                }
                if (rc && minor_version >= 8)
                {
                  rc = file.ReadBoundingBox(m_vertex_bbox);
                }
                if (bHasInvalidDoublePrecisionVertices)
                {
                  m_vertex_bbox.Set(m_V, false);
                }
              }
            }
          }
        }
      }
    }

    if (    0 == m_S.Count()
         && m_V.Count() > 0
         && HasTextureCoordinates()
         && m_srf_domain[0].IsIncreasing() 
         && m_srf_domain[1].IsIncreasing() 
         && m_packed_tex_domain[0].IsInterval()
         && m_packed_tex_domain[1].IsInterval()
         && 0 == m_Ttag.m_mapping_crc
         && ON_UuidIsNil(m_Ttag.m_mapping_id)
          ) 
    {
      // This is a mesh from an old file - but there is enough 
      // information to calculate the m_S[] values from the 
      // m_T[] values.
      m_S.SetCapacity(vcount);
      m_S.SetCount(0);
      ON_2dPoint sp;
      ON_2fPoint tc;
      for ( i = 0; i < vcount; i++)
      {
        tc = m_T[i];
        sp.x = tc.x;
        sp.y = tc.y;
        GetSurfaceParametersHelper(*this,sp.x,sp.y,&sp.x,&sp.y);
        m_S.Append(sp);
      }
      m_Ttag.SetDefaultSurfaceParameterMappingTag();
    }
  }

  return rc;
}